

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

value_type * __thiscall
wasm::Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
          (Random *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *vec)

{
  pointer pHVar1;
  pointer pHVar2;
  uint32_t uVar3;
  
  pHVar1 = (vec->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pHVar2 = (vec->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar1 != pHVar2) {
    uVar3 = upTo(this,(uint32_t)((ulong)((long)pHVar2 - (long)pHVar1) >> 3));
    return (vec->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_start + uVar3;
  }
  __assert_fail("!vec.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                ,0x50,
                "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<wasm::HeapType>]"
               );
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }